

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarketDataRequest.h
# Opt level: O1

void __thiscall
FIX43::MarketDataRequest::MarketDataRequest
          (MarketDataRequest *this,MDReqID *aMDReqID,
          SubscriptionRequestType *aSubscriptionRequestType,MarketDepth *aMarketDepth)

{
  FieldBase local_80;
  
  MsgType();
  Message::Message(&this->super_Message,(MsgType *)&local_80);
  FIX::FieldBase::~FieldBase(&local_80);
  *(undefined ***)&this->super_Message = &PTR__Message_00162758;
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aMDReqID,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aSubscriptionRequestType,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aMarketDepth,true);
  return;
}

Assistant:

MarketDataRequest(
      const FIX::MDReqID& aMDReqID,
      const FIX::SubscriptionRequestType& aSubscriptionRequestType,
      const FIX::MarketDepth& aMarketDepth )
    : Message(MsgType())
    {
      set(aMDReqID);
      set(aSubscriptionRequestType);
      set(aMarketDepth);
    }